

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall
cmTargetInternals::ComputeLinkInterfaceLibraries
          (cmTargetInternals *this,cmTarget *thisTarget,string *config,OptionalLinkInterface *iface,
          cmTarget *headTarget,bool usage_requirements_only)

{
  PolicyMap *this_00;
  cmMakefile *pcVar1;
  cmLinkItem *__first2;
  bool bVar2;
  PolicyStatus PVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  ostream *poVar7;
  size_t sVar8;
  LinkImplementationLibraries *r;
  PolicyID id;
  PolicyID id_00;
  undefined7 in_register_00000089;
  size_type __dnew;
  size_type local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  undefined4 local_25c;
  cmTargetInternals *local_258;
  string linkIfaceProp;
  string suffix;
  string local_208;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> ifaceLibs;
  string newLibraries;
  ostringstream w;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_25c = (undefined4)CONCAT71(in_register_00000089,usage_requirements_only);
  suffix._M_dataplus._M_p = (pointer)&suffix.field_2;
  suffix.field_2._M_allocated_capacity._0_2_ = 0x5f;
  suffix._M_string_length = 1;
  local_258 = this;
  if (config->_M_string_length == 0) {
    std::__cxx11::string::append((char *)&suffix);
  }
  else {
    cmsys::SystemTools::UpperCase((string *)&w,config);
    std::__cxx11::string::_M_append((char *)&suffix,(ulong)_w);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_w != local_198) {
      operator_delete(_w,local_198[0]._M_allocated_capacity + 1);
    }
  }
  linkIfaceProp._M_dataplus._M_p = (pointer)&linkIfaceProp.field_2;
  linkIfaceProp._M_string_length = 0;
  linkIfaceProp.field_2._M_local_buf[0] = '\0';
  this_00 = &thisTarget->PolicyMap;
  PVar3 = cmPolicies::PolicyMap::Get(this_00,CMP0022);
  if ((PVar3 == OLD) || (PVar3 = cmPolicies::PolicyMap::Get(this_00,CMP0022), PVar3 == WARN)) {
    if ((thisTarget->TargetTypeValue != SHARED_LIBRARY) &&
       (bVar2 = cmTarget::IsExecutableWithExports(thisTarget), !bVar2)) {
      pcVar5 = (char *)0x0;
      goto LAB_00370951;
    }
    std::__cxx11::string::_M_replace
              ((ulong)&linkIfaceProp,0,(char *)linkIfaceProp._M_string_length,0x59e441);
    std::__cxx11::string::_M_append((char *)&linkIfaceProp,(ulong)suffix._M_dataplus._M_p);
    pcVar5 = cmTarget::GetProperty(thisTarget,&linkIfaceProp,thisTarget->Makefile);
    if (pcVar5 != (char *)0x0) goto LAB_00370951;
    std::__cxx11::string::_M_replace
              ((ulong)&linkIfaceProp,0,(char *)linkIfaceProp._M_string_length,0x59e441);
  }
  else {
    std::__cxx11::string::_M_replace
              ((ulong)&linkIfaceProp,0,(char *)linkIfaceProp._M_string_length,0x59e0f8);
  }
  pcVar5 = cmTarget::GetProperty(thisTarget,&linkIfaceProp,thisTarget->Makefile);
LAB_00370951:
  if (pcVar5 == (char *)0x0) {
    if ((thisTarget->TargetTypeValue != EXECUTABLE) &&
       (thisTarget->TargetTypeValue != MODULE_LIBRARY)) {
      (iface->super_LinkInterface).field_0x6b = 1;
      iface->ExplicitLibraries = (char *)0x0;
      PVar3 = cmPolicies::PolicyMap::Get(this_00,CMP0022);
      if ((PVar3 == WARN) || (PVar3 = cmPolicies::PolicyMap::Get(this_00,CMP0022), PVar3 == OLD)) {
        r = cmTarget::GetLinkImplementationLibrariesInternal(thisTarget,config,headTarget);
        std::vector<cmLinkItem,std::allocator<cmLinkItem>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<cmLinkImplItem_const*,std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>>>
                  ((vector<cmLinkItem,std::allocator<cmLinkItem>> *)iface,
                   (iface->super_LinkInterface).super_LinkInterfaceLibraries.Libraries.
                   super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (r->Libraries).
                   super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (r->Libraries).
                   super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        PVar3 = cmPolicies::PolicyMap::Get(this_00,CMP0022);
        if ((PVar3 == WARN) && ((char)local_25c == '\0' && local_258->PolicyWarnedCMP0022 == false))
        {
          ifaceLibs.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ifaceLibs.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ifaceLibs.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((ComputeLinkInterfaceLibraries(cmTarget_const*,std::__cxx11::string_const&,cmTargetInternals::OptionalLinkInterface&,cmTarget_const*,bool)
               ::newProp_abi_cxx11_ == '\0') &&
             (iVar4 = __cxa_guard_acquire(&ComputeLinkInterfaceLibraries(cmTarget_const*,std::__cxx11::string_const&,cmTargetInternals::OptionalLinkInterface&,cmTarget_const*,bool)
                                           ::newProp_abi_cxx11_), iVar4 != 0)) {
            ComputeLinkInterfaceLibraries(cmTarget_const*,std::__cxx11::string_const&,cmTargetInternals::OptionalLinkInterface&,cmTarget_const*,bool)
            ::newProp_abi_cxx11_._M_dataplus._M_p =
                 (pointer)&ComputeLinkInterfaceLibraries(cmTarget_const*,std::__cxx11::string_const&,cmTargetInternals::OptionalLinkInterface&,cmTarget_const*,bool)
                           ::newProp_abi_cxx11_.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)
                       &ComputeLinkInterfaceLibraries(cmTarget_const*,std::__cxx11::string_const&,cmTargetInternals::OptionalLinkInterface&,cmTarget_const*,bool)
                        ::newProp_abi_cxx11_,"INTERFACE_LINK_LIBRARIES","");
            __cxa_atexit(std::__cxx11::string::~string,
                         &ComputeLinkInterfaceLibraries(cmTarget_const*,std::__cxx11::string_const&,cmTargetInternals::OptionalLinkInterface&,cmTarget_const*,bool)
                          ::newProp_abi_cxx11_,&__dso_handle);
            __cxa_guard_release(&ComputeLinkInterfaceLibraries(cmTarget_const*,std::__cxx11::string_const&,cmTargetInternals::OptionalLinkInterface&,cmTarget_const*,bool)
                                 ::newProp_abi_cxx11_);
          }
          pcVar5 = cmTarget::GetProperty
                             (thisTarget,
                              &ComputeLinkInterfaceLibraries(cmTarget_const*,std::__cxx11::string_const&,cmTargetInternals::OptionalLinkInterface&,cmTarget_const*,bool)
                               ::newProp_abi_cxx11_,thisTarget->Makefile);
          if (pcVar5 != (char *)0x0) {
            __dnew = __dnew & 0xffffffffffffff00;
            _w = (pointer)local_198;
            sVar8 = strlen(pcVar5);
            std::__cxx11::string::_M_construct<char_const*>((string *)&w,pcVar5,pcVar5 + sVar8);
            cmTarget::ExpandLinkItems
                      (thisTarget,
                       &ComputeLinkInterfaceLibraries(cmTarget_const*,std::__cxx11::string_const&,cmTargetInternals::OptionalLinkInterface&,cmTarget_const*,bool)
                        ::newProp_abi_cxx11_,(string *)&w,config,headTarget,false,&ifaceLibs,
                       (bool *)&__dnew);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_w != local_198) {
              operator_delete(_w,local_198[0]._M_allocated_capacity + 1);
            }
          }
          __first2 = (iface->super_LinkInterface).super_LinkInterfaceLibraries.Libraries.
                     super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                     super__Vector_impl_data._M_start;
          if (((long)ifaceLibs.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)ifaceLibs.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                     super__Vector_impl_data._M_start !=
               (long)(iface->super_LinkInterface).super_LinkInterfaceLibraries.Libraries.
                     super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)__first2) ||
             (bVar2 = std::__equal<false>::equal<cmLinkItem_const*,cmLinkItem_const*>
                                (ifaceLibs.
                                 super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl
                                 .super__Vector_impl_data._M_start,
                                 ifaceLibs.
                                 super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl
                                 .super__Vector_impl_data._M_finish,__first2), !bVar2)) {
            cmJoin<std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>>
                      ((string *)&__dnew,&r->Libraries,";");
            cmJoin<std::vector<cmLinkItem,std::allocator<cmLinkItem>>>(&newLibraries,&ifaceLibs,";")
            ;
            if (local_278 == 0) {
              std::__cxx11::string::operator=((string *)&__dnew,"(empty)");
            }
            if (newLibraries._M_string_length == 0) {
              std::__cxx11::string::operator=((string *)&newLibraries,"(empty)");
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_208,(cmPolicies *)0x16,id_00);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&w,local_208._M_dataplus._M_p,local_208._M_string_length)
            ;
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\nTarget \"",9);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(thisTarget->Name)._M_dataplus._M_p,
                                (thisTarget->Name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,
                       "\" has an INTERFACE_LINK_LIBRARIES property.  This should be preferred as the source of the link interface for this library but because CMP0022 is not set CMake is ignoring the property and using the link implementation as the link interface instead.\nINTERFACE_LINK_LIBRARIES:\n  "
                       ,0x116);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,newLibraries._M_dataplus._M_p,newLibraries._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"\nLink implementation:\n  ",0x18);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(char *)__dnew,local_278);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1
                             );
            }
            pcVar1 = thisTarget->Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_208);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1
                             );
            }
            local_258->PolicyWarnedCMP0022 = true;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
            std::ios_base::~ios_base(local_138);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)newLibraries._M_dataplus._M_p != &newLibraries.field_2) {
              operator_delete(newLibraries._M_dataplus._M_p,
                              newLibraries.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__dnew != &local_270) {
              operator_delete((void *)__dnew,local_270._M_allocated_capacity + 1);
            }
          }
          std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector(&ifaceLibs);
        }
      }
    }
  }
  else {
    PVar3 = cmPolicies::PolicyMap::Get(this_00,CMP0022);
    if ((PVar3 == WARN) && (local_258->PolicyWarnedCMP0022 == false)) {
      __dnew = 0x18;
      _w = (pointer)local_198;
      _w = (pointer)std::__cxx11::string::_M_create((ulong *)&w,(ulong)&__dnew);
      local_198[0]._M_allocated_capacity = __dnew;
      *(undefined8 *)_w = 0x4341465245544e49;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_w + 8) = 'E';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_w + 9) = '_';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_w + 10) = 'L';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_w + 0xb) = 'I';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_w + 0xc) = 'N';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_w + 0xd) = 'K';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_w + 0xe) = '_';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_w + 0xf) = 'L';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_w + 0x10) = 'I';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_w + 0x11) = 'B';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_w + 0x12) = 'R';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_w + 0x13) = 'A';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_w + 0x14) = 'R';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_w + 0x15) = 'I';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_w + 0x16) = 'E';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_w + 0x17) = 'S';
      _w[__dnew] = '\0';
      pcVar6 = cmTarget::GetProperty(thisTarget,(string *)&w,thisTarget->Makefile);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_w != local_198) {
        operator_delete(_w,local_198[0]._M_allocated_capacity + 1);
      }
      if ((pcVar6 != (char *)0x0) && (iVar4 = strcmp(pcVar6,pcVar5), iVar4 != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&__dnew,(cmPolicies *)0x16,id);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&w,(char *)__dnew,local_278);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\nTarget \"",9);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(thisTarget->Name)._M_dataplus._M_p,
                            (thisTarget->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"\" has an INTERFACE_LINK_LIBRARIES property which differs from its ",0x42
                  );
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,linkIfaceProp._M_dataplus._M_p,linkIfaceProp._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7," properties.\nINTERFACE_LINK_LIBRARIES:\n  ",0x29);
        sVar8 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,linkIfaceProp._M_dataplus._M_p,linkIfaceProp._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,":\n  ",4);
        sVar8 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar5,sVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__dnew != &local_270) {
          operator_delete((void *)__dnew,local_270._M_allocated_capacity + 1);
        }
        pcVar1 = thisTarget->Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,(string *)&__dnew);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__dnew != &local_270) {
          operator_delete((void *)__dnew,local_270._M_allocated_capacity + 1);
        }
        local_258->PolicyWarnedCMP0022 = true;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
        std::ios_base::~ios_base(local_138);
      }
    }
    (iface->super_LinkInterface).field_0x6b = 1;
    iface->ExplicitLibraries = pcVar5;
    _w = (pointer)local_198;
    if (pcVar5 == (char *)0x0) {
      pcVar6 = &DAT_00000001;
    }
    else {
      sVar8 = strlen(pcVar5);
      pcVar6 = pcVar5 + sVar8;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&w,pcVar5,pcVar6);
    cmTarget::ExpandLinkItems
              (thisTarget,&linkIfaceProp,(string *)&w,config,headTarget,local_25c._0_1_,
               (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface,
               (bool *)&(iface->super_LinkInterface).field_0x6c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_w != local_198) {
      operator_delete(_w,local_198[0]._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkIfaceProp._M_dataplus._M_p != &linkIfaceProp.field_2) {
    operator_delete(linkIfaceProp._M_dataplus._M_p,
                    CONCAT71(linkIfaceProp.field_2._M_allocated_capacity._1_7_,
                             linkIfaceProp.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)suffix._M_dataplus._M_p != &suffix.field_2) {
    operator_delete(suffix._M_dataplus._M_p,
                    CONCAT62(suffix.field_2._M_allocated_capacity._2_6_,
                             suffix.field_2._M_allocated_capacity._0_2_) + 1);
  }
  return;
}

Assistant:

void
cmTargetInternals::ComputeLinkInterfaceLibraries(
  cmTarget const* thisTarget,
  const std::string& config,
  OptionalLinkInterface& iface,
  cmTarget const* headTarget,
  bool usage_requirements_only)
{
  // Construct the property name suffix for this configuration.
  std::string suffix = "_";
  if(!config.empty())
    {
    suffix += cmSystemTools::UpperCase(config);
    }
  else
    {
    suffix += "NOCONFIG";
    }

  // An explicit list of interface libraries may be set for shared
  // libraries and executables that export symbols.
  const char* explicitLibraries = 0;
  std::string linkIfaceProp;
  if(thisTarget->GetPolicyStatusCMP0022() != cmPolicies::OLD &&
     thisTarget->GetPolicyStatusCMP0022() != cmPolicies::WARN)
    {
    // CMP0022 NEW behavior is to use INTERFACE_LINK_LIBRARIES.
    linkIfaceProp = "INTERFACE_LINK_LIBRARIES";
    explicitLibraries = thisTarget->GetProperty(linkIfaceProp);
    }
  else if(thisTarget->GetType() == cmTarget::SHARED_LIBRARY ||
          thisTarget->IsExecutableWithExports())
    {
    // CMP0022 OLD behavior is to use LINK_INTERFACE_LIBRARIES if set on a
    // shared lib or executable.

    // Lookup the per-configuration property.
    linkIfaceProp = "LINK_INTERFACE_LIBRARIES";
    linkIfaceProp += suffix;
    explicitLibraries = thisTarget->GetProperty(linkIfaceProp);

    // If not set, try the generic property.
    if(!explicitLibraries)
      {
      linkIfaceProp = "LINK_INTERFACE_LIBRARIES";
      explicitLibraries = thisTarget->GetProperty(linkIfaceProp);
      }
    }

  if(explicitLibraries &&
     thisTarget->GetPolicyStatusCMP0022() == cmPolicies::WARN &&
     !this->PolicyWarnedCMP0022)
    {
    // Compare the explicitly set old link interface properties to the
    // preferred new link interface property one and warn if different.
    const char* newExplicitLibraries =
      thisTarget->GetProperty("INTERFACE_LINK_LIBRARIES");
    if (newExplicitLibraries
        && strcmp(newExplicitLibraries, explicitLibraries) != 0)
      {
      std::ostringstream w;
      w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0022) << "\n"
        "Target \"" << thisTarget->GetName() << "\" has an "
        "INTERFACE_LINK_LIBRARIES property which differs from its " <<
        linkIfaceProp << " properties."
        "\n"
        "INTERFACE_LINK_LIBRARIES:\n"
        "  " << newExplicitLibraries << "\n" <<
        linkIfaceProp << ":\n"
        "  " << (explicitLibraries ? explicitLibraries : "(empty)") << "\n";
      thisTarget->Makefile->IssueMessage(cmake::AUTHOR_WARNING, w.str());
      this->PolicyWarnedCMP0022 = true;
      }
    }

  // There is no implicit link interface for executables or modules
  // so if none was explicitly set then there is no link interface.
  if(!explicitLibraries &&
     (thisTarget->GetType() == cmTarget::EXECUTABLE ||
      (thisTarget->GetType() == cmTarget::MODULE_LIBRARY)))
    {
    return;
    }
  iface.Exists = true;
  iface.ExplicitLibraries = explicitLibraries;

  if(explicitLibraries)
    {
    // The interface libraries have been explicitly set.
    thisTarget->ExpandLinkItems(linkIfaceProp, explicitLibraries, config,
                                headTarget, usage_requirements_only,
                                iface.Libraries,
                                iface.HadHeadSensitiveCondition);
    }
  else if (thisTarget->GetPolicyStatusCMP0022() == cmPolicies::WARN
        || thisTarget->GetPolicyStatusCMP0022() == cmPolicies::OLD)
    // If CMP0022 is NEW then the plain tll signature sets the
    // INTERFACE_LINK_LIBRARIES, so if we get here then the project
    // cleared the property explicitly and we should not fall back
    // to the link implementation.
    {
    // The link implementation is the default link interface.
    cmTarget::LinkImplementationLibraries const* impl =
      thisTarget->GetLinkImplementationLibrariesInternal(config, headTarget);
    iface.Libraries.insert(iface.Libraries.end(),
                           impl->Libraries.begin(), impl->Libraries.end());
    if(thisTarget->GetPolicyStatusCMP0022() == cmPolicies::WARN &&
       !this->PolicyWarnedCMP0022 && !usage_requirements_only)
      {
      // Compare the link implementation fallback link interface to the
      // preferred new link interface property and warn if different.
      std::vector<cmLinkItem> ifaceLibs;
      static const std::string newProp = "INTERFACE_LINK_LIBRARIES";
      if(const char* newExplicitLibraries = thisTarget->GetProperty(newProp))
        {
        bool hadHeadSensitiveConditionDummy = false;
        thisTarget->ExpandLinkItems(newProp, newExplicitLibraries, config,
                                    headTarget, usage_requirements_only,
                                ifaceLibs, hadHeadSensitiveConditionDummy);
        }
      if (ifaceLibs != iface.Libraries)
        {
        std::string oldLibraries = cmJoin(impl->Libraries, ";");
        std::string newLibraries = cmJoin(ifaceLibs, ";");
        if(oldLibraries.empty())
          { oldLibraries = "(empty)"; }
        if(newLibraries.empty())
          { newLibraries = "(empty)"; }

        std::ostringstream w;
        w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0022) << "\n"
          "Target \"" << thisTarget->GetName() << "\" has an "
          "INTERFACE_LINK_LIBRARIES property.  "
          "This should be preferred as the source of the link interface "
          "for this library but because CMP0022 is not set CMake is "
          "ignoring the property and using the link implementation "
          "as the link interface instead."
          "\n"
          "INTERFACE_LINK_LIBRARIES:\n"
          "  " << newLibraries << "\n"
          "Link implementation:\n"
          "  " << oldLibraries << "\n";
        thisTarget->Makefile->IssueMessage(cmake::AUTHOR_WARNING, w.str());
        this->PolicyWarnedCMP0022 = true;
        }
      }
    }
}